

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  ParseResult PVar3;
  ClearStackOnExit scope;
  undefined4 in_stack_ffffffffffffff88;
  ParseErrorCode in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ClearStackOnExit local_30 [4];
  ulong local_10;
  size_t local_8;
  
  ParseResult::Clear((ParseResult *)0x10a5b6);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::ClearStackOnExit(local_30,in_RDI);
  SkipWhitespaceAndComments<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x10a5e2);
  if (bVar1) {
    local_10 = *(ulong *)&in_RDI->parseResult_;
    local_8 = (in_RDI->parseResult_).offset_;
    goto LAB_0010a84f;
  }
  CVar2 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek
                    ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10a645)
  ;
  if (CVar2 == '\0') {
    EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Tell
              ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10a66e);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c,0x10a689);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x10a69b);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0010a84f;
    }
  }
  else {
    ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT17(in_stack_ffffffffffffffa7,
                           CONCAT16(in_stack_ffffffffffffffa6,
                                    CONCAT15(in_stack_ffffffffffffffa5,
                                             CONCAT14(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0)))),
               in_stack_ffffffffffffff98,
               (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x10a6fe);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0010a84f;
    }
    SkipWhitespaceAndComments<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x10a757);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0010a84f;
    }
    CVar2 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek
                      ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)
                       0x10a79d);
    if (CVar2 != '\0') {
      EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Tell
                ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10a7c6);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c,0x10a7e1);
      bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x10a7f3);
      if (bVar1) {
        local_10 = *(ulong *)&in_RDI->parseResult_;
        local_8 = (in_RDI->parseResult_).offset_;
        goto LAB_0010a84f;
      }
    }
  }
  local_10 = *(ulong *)&in_RDI->parseResult_;
  local_8 = (in_RDI->parseResult_).offset_;
LAB_0010a84f:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::~ClearStackOnExit((ClearStackOnExit *)0x10a859);
  PVar3._0_8_ = local_10 & 0xffffffff;
  PVar3.offset_ = local_8;
  return PVar3;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }